

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall wasm::DataFlow::Node::addValue(Node *this,Node *value)

{
  Node *local_10;
  Node *value_local;
  
  local_10 = value;
  std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::push_back
            (&this->values,&local_10);
  return;
}

Assistant:

void addValue(Node* value) { values.push_back(value); }